

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 CalcSizeAutoFit(ImGuiWindow *window,ImVec2 *size_contents)

{
  ImGuiContext *pIVar1;
  uint uVar2;
  uint uVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float local_28;
  float fStack_24;
  
  pIVar1 = GImGui;
  if ((window->Flags & 0x2000000) == 0) {
    IVar4 = (GImGui->Style).DisplaySafeAreaPadding;
    fVar6 = IVar4.x;
    fVar7 = IVar4.y;
    IVar4 = (GImGui->IO).DisplaySize;
    fVar6 = IVar4.x - (fVar6 + fVar6);
    fVar7 = IVar4.y - (fVar7 + fVar7);
    IVar4 = (GImGui->Style).WindowMinSize;
    fVar8 = IVar4.x;
    fVar9 = IVar4.y;
    uVar2 = -(uint)(fVar6 <= fVar8);
    uVar3 = -(uint)(fVar7 <= fVar9);
    IVar4 = ImClamp(size_contents,&(GImGui->Style).WindowMinSize,
                    (ImVec2)(CONCAT44(~uVar3 & (uint)fVar7,~uVar2 & (uint)fVar6) |
                            CONCAT44((uint)fVar9 & uVar3,(uint)fVar8 & uVar2)));
    IVar5 = CalcSizeAfterConstraint(window,IVar4);
    local_28 = IVar4.x;
    fStack_24 = IVar4.y;
    if ((IVar5.x < size_contents->x) && ((window->Flags & 0x808U) == 0x800)) {
      fStack_24 = fStack_24 + (pIVar1->Style).ScrollbarSize;
    }
    if ((IVar5.y < size_contents->y) && ((window->Flags & 8) == 0)) {
      local_28 = local_28 + (pIVar1->Style).ScrollbarSize;
    }
  }
  else {
    local_28 = (*size_contents).x;
    fStack_24 = (*size_contents).y;
  }
  IVar4.y = fStack_24;
  IVar4.x = local_28;
  return IVar4;
}

Assistant:

static ImVec2 CalcSizeAutoFit(ImGuiWindow* window, const ImVec2& size_contents)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Tooltip always resize
        return size_contents;
    }
    else
    {
        // When the window cannot fit all contents (either because of constraints, either because screen is too small): we are growing the size on the other axis to compensate for expected scrollbar. FIXME: Might turn bigger than DisplaySize-WindowPadding.
        ImVec2 size_auto_fit = ImClamp(size_contents, style.WindowMinSize, ImMax(style.WindowMinSize, g.IO.DisplaySize - g.Style.DisplaySafeAreaPadding * 2.0f));
        ImVec2 size_auto_fit_after_constraint = CalcSizeAfterConstraint(window, size_auto_fit);
        if (size_auto_fit_after_constraint.x < size_contents.x && !(window->Flags & ImGuiWindowFlags_NoScrollbar) && (window->Flags & ImGuiWindowFlags_HorizontalScrollbar))
            size_auto_fit.y += style.ScrollbarSize;
        if (size_auto_fit_after_constraint.y < size_contents.y && !(window->Flags & ImGuiWindowFlags_NoScrollbar))
            size_auto_fit.x += style.ScrollbarSize;
        return size_auto_fit;
    }
}